

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void qt_alphamapblit_argb32_oneline
               (uchar *map,int mapWidth,QRgba64 *srcColor,quint32 *dest,quint32 c,
               QColorTrcLut *colorProfile)

{
  byte bVar1;
  uint uVar2;
  _Head_base<0UL,_unsigned_short_*,_false> _Var3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [12];
  undefined1 auVar15 [14];
  undefined1 auVar16 [12];
  undefined1 auVar17 [14];
  undefined1 auVar18 [12];
  undefined1 auVar19 [14];
  undefined1 auVar20 [12];
  undefined1 auVar21 [14];
  unkbyte10 Var22;
  ushort uVar23;
  QRgb QVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  QRgba64 rgb64;
  ulong uVar30;
  undefined2 uVar31;
  undefined1 uVar36;
  byte bVar37;
  byte bVar38;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  short sVar41;
  short sVar47;
  short sVar48;
  short sVar49;
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  short sVar50;
  short sVar55;
  short sVar56;
  short sVar57;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ushort uVar61;
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 uVar35;
  undefined1 auVar43 [16];
  undefined1 auVar54 [16];
  undefined1 auVar59 [16];
  
  if (0 < mapWidth) {
    uVar26 = ((ulong)c << 0x18 | (ulong)c) & 0xff00ff00ff00ff;
    uVar30 = 0;
    do {
      bVar1 = map[uVar30];
      if (bVar1 != 0) {
        uVar27 = (uint)bVar1;
        if ((colorProfile == (QColorTrcLut *)0x0) || (bVar1 == 0xff)) {
          if (uVar27 == 0xff) {
            QVar24 = c;
            if (c < 0xff000000) {
              if (c == 0) goto LAB_0066ffbe;
              uVar29 = (((ulong)dest[uVar30] << 0x18 | (ulong)dest[uVar30]) & 0xff00ff00ff00ff) *
                       (ulong)(~c >> 0x18);
              uVar29 = uVar29 + 0x80008000800080 + (uVar29 >> 8 & 0xff00ff00ff00ff) >> 8 &
                       0xff00ff00ff00ff;
              QVar24 = ((uint)(uVar29 >> 0x18) | (uint)uVar29) + c;
            }
          }
          else {
            if (c == 0) goto LAB_0066ffbe;
            uVar29 = uVar26 * bVar1;
            uVar25 = uVar29 + 0x80008000800080 + (uVar29 >> 8 & 0xff00ff00ff00ff);
            uVar29 = uVar25 >> 8 & 0xff00ff00ff00ff;
            uVar25 = (((ulong)dest[uVar30] << 0x18 | (ulong)dest[uVar30]) & 0xff00ff00ff00ff) *
                     (~uVar25 >> 0x38);
            uVar25 = uVar25 + 0x80008000800080 + (uVar25 >> 8 & 0xff00ff00ff00ff) >> 8 &
                     0xff00ff00ff00ff;
            QVar24 = ((uint)(uVar25 >> 0x18) | (uint)uVar25) +
                     ((uint)(uVar29 >> 0x18) | (uint)uVar29);
          }
        }
        else {
          uVar2 = dest[uVar30];
          uVar29 = (ulong)uVar2;
          if (uVar2 >> 0x18 < 0xff) {
            if (c == 0) goto LAB_0066ffbe;
            uVar25 = uVar27 * uVar26;
            uVar25 = uVar25 + 0x80008000800080 + (uVar25 >> 8 & 0xff00ff00ff00ff);
            uVar28 = uVar25 >> 8 & 0xff00ff00ff00ff;
            uVar29 = ((uVar29 << 0x18 | uVar29) & 0xff00ff00ff00ff) * (~uVar25 >> 0x38);
            uVar29 = uVar29 + 0x80008000800080 + (uVar29 >> 8 & 0xff00ff00ff00ff) >> 8 &
                     0xff00ff00ff00ff;
            QVar24 = ((uint)(uVar29 >> 0x18) | (uint)uVar29) +
                     ((uint)(uVar28 >> 0x18) | (uint)uVar28);
          }
          else {
            uVar35 = (undefined1)(uVar2 >> 8);
            uVar36 = (undefined1)(uVar2 >> 0x10);
            bVar37 = (byte)(uVar2 >> 0x18);
            uVar31 = (undefined2)uVar2;
            if (c < 0xff000000) {
              uVar27 = uVar2;
              if (c != 0) {
                uVar29 = ((uVar29 << 0x18 | uVar29) & 0xff00ff00ff00ff) * (ulong)(~c >> 0x18);
                uVar29 = uVar29 + 0x80008000800080 + (uVar29 >> 8 & 0xff00ff00ff00ff) >> 8 &
                         0xff00ff00ff00ff;
                uVar27 = ((uint)(uVar29 >> 0x18) | (uint)uVar29) + c;
              }
              _Var3._M_head_impl =
                   (colorProfile->m_toLinear)._M_t.
                   super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
                   super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
              if (_Var3._M_head_impl == (unsigned_short *)0x0) {
                qt_alphamapblit_argb32_oneline();
                goto LAB_0066ffde;
              }
              bVar38 = (byte)(uVar27 >> 0x18);
              auVar32 = psllw(ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((
                                                  uint7)bVar38 << 0x30) >> 0x28),
                                                  CONCAT14((char)(uVar27 >> 0x10),uVar27)) >> 0x20),
                                                  uVar27) >> 0x18),(char)(uVar27 >> 8)),
                                               (ushort)(byte)uVar27) & 0xffffff00ffffff),4);
              uVar61 = SUB162(ZEXT116(bVar38) << 0x38,6);
              auVar44._8_8_ = 0;
              auVar44._0_8_ =
                   (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)
                                                  bVar37 << 0x30) >> 0x28),CONCAT14(uVar36,uVar2))
                                                  >> 0x20),uVar2) >> 0x18),CONCAT12(uVar35,uVar31))
                                         >> 0x10),uVar31) & 0xffff00ff00ff00ff;
              auVar51 = psllw(auVar44,4);
              uVar23 = SUB162(ZEXT116(bVar37) << 0x38,6);
              sVar41 = (_Var3._M_head_impl[auVar32._4_2_] >> 8) + _Var3._M_head_impl[auVar32._4_2_];
              sVar47 = (_Var3._M_head_impl[auVar32._2_2_] >> 8) + _Var3._M_head_impl[auVar32._2_2_];
              auVar52._2_2_ = sVar47;
              auVar52._0_2_ = sVar41;
              sVar48 = (_Var3._M_head_impl[auVar32._0_2_] >> 8) + _Var3._M_head_impl[auVar32._0_2_];
              auVar52._4_2_ = sVar48;
              sVar49 = (uVar61 >> 8) + uVar61;
              auVar52._6_2_ = sVar49;
              sVar50 = (_Var3._M_head_impl[auVar51._4_2_] >> 8) + _Var3._M_head_impl[auVar51._4_2_];
              sVar55 = (_Var3._M_head_impl[auVar51._2_2_] >> 8) + _Var3._M_head_impl[auVar51._2_2_];
              auVar45._2_2_ = sVar55;
              auVar45._0_2_ = sVar50;
              sVar56 = (_Var3._M_head_impl[auVar51._0_2_] >> 8) + _Var3._M_head_impl[auVar51._0_2_];
              auVar45._4_2_ = sVar56;
              sVar57 = (uVar23 >> 8) + uVar23;
              auVar45._6_2_ = sVar57;
              auVar52._8_8_ = 0;
              auVar45._8_8_ = 0;
              auVar60 = pshuflw(ZEXT216(CONCAT11(bVar1,bVar1)),ZEXT216(CONCAT11(bVar1,bVar1)),0);
              uVar61 = sVar49 * auVar60._6_2_;
              auVar32._0_10_ = (unkuint10)uVar61 << 0x30;
              auVar51._0_12_ = ZEXT212(uVar61) << 0x30;
              auVar52 = pmulhuw(auVar52,auVar60);
              auVar51._12_2_ = uVar61;
              auVar51._14_2_ = auVar52._6_2_;
              auVar32._12_4_ = auVar51._12_4_;
              auVar32._10_2_ = auVar52._4_2_;
              Var22 = CONCAT64(auVar32._10_6_,CONCAT22(sVar48 * auVar60._4_2_,uVar61));
              auVar18._4_8_ = (long)((unkuint10)Var22 >> 0x10);
              auVar18._2_2_ = auVar52._2_2_;
              auVar18._0_2_ = sVar47 * auVar60._2_2_;
              auVar8._10_2_ = 0;
              auVar8._0_10_ = auVar52._0_10_;
              auVar8._12_2_ = auVar52._6_2_;
              auVar11._8_2_ = auVar52._4_2_;
              auVar11._0_8_ = auVar52._0_8_;
              auVar11._10_4_ = auVar8._10_4_;
              auVar19._6_8_ = 0;
              auVar19._0_6_ = auVar11._8_6_;
              auVar60._0_4_ =
                   (int)((uint)auVar52._0_2_ + CONCAT22(auVar52._0_2_,sVar41 * auVar60._0_2_) +
                        0x8000) >> 0x10;
              auVar60._4_4_ =
                   (int)CONCAT82(SUB148(auVar19 << 0x40,6),auVar52._2_2_) + auVar18._0_4_ + 0x8000
                   >> 0x10;
              auVar60._8_4_ = auVar11._8_4_ + (int)((unkuint10)Var22 >> 0x10) + 0x8000 >> 0x10;
              auVar60._12_4_ = (int)((auVar8._10_4_ >> 0x10) + auVar32._12_4_ + 0x8000) >> 0x10;
              auVar51 = packssdw(auVar60,auVar60);
              auVar32 = ZEXT416((bVar1 ^ 0xff) << 8 | bVar1 ^ 0xff);
              auVar32 = pshuflw(auVar32,auVar32,0);
              uVar61 = sVar57 * auVar32._6_2_;
              auVar53._0_10_ = (unkuint10)uVar61 << 0x30;
              auVar54._0_12_ = ZEXT212(uVar61) << 0x30;
              auVar52 = pmulhuw(auVar45,auVar32);
              auVar54._12_2_ = uVar61;
              auVar54._14_2_ = auVar52._6_2_;
              auVar53._12_4_ = auVar54._12_4_;
              auVar53._10_2_ = auVar52._4_2_;
              Var22 = CONCAT64(auVar53._10_6_,CONCAT22(sVar56 * auVar32._4_2_,uVar61));
              auVar20._4_8_ = (long)((unkuint10)Var22 >> 0x10);
              auVar20._2_2_ = auVar52._2_2_;
              auVar20._0_2_ = sVar55 * auVar32._2_2_;
              auVar5._10_2_ = 0;
              auVar5._0_10_ = auVar52._0_10_;
              auVar5._12_2_ = auVar52._6_2_;
              auVar9._8_2_ = auVar52._4_2_;
              auVar9._0_8_ = auVar52._0_8_;
              auVar9._10_4_ = auVar5._10_4_;
              auVar21._6_8_ = 0;
              auVar21._0_6_ = auVar9._8_6_;
              auVar13._4_2_ = auVar52._2_2_;
              auVar13._0_4_ = auVar52._0_4_;
              auVar13._6_8_ = SUB148(auVar21 << 0x40,6);
              auVar46._0_4_ =
                   (int)((auVar52._0_4_ & 0xffff) + CONCAT22(auVar52._0_2_,sVar50 * auVar32._0_2_) +
                        0x8000) >> 0x10;
              auVar46._4_4_ = auVar13._4_4_ + auVar20._0_4_ + 0x8000 >> 0x10;
              auVar46._8_4_ = auVar9._8_4_ + (int)((unkuint10)Var22 >> 0x10) + 0x8000 >> 0x10;
              auVar46._12_4_ = (int)((auVar5._10_4_ >> 0x10) + auVar53._12_4_ + 0x8000) >> 0x10;
              auVar32 = packssdw(auVar46,auVar46);
              rgb64.rgba = CONCAT26(auVar32._6_2_ + auVar51._6_2_,
                                    CONCAT24(auVar32._4_2_ + auVar51._4_2_,
                                             CONCAT22(auVar32._2_2_ + auVar51._2_2_,
                                                      auVar32._0_2_ + auVar51._0_2_)));
            }
            else {
              _Var3._M_head_impl =
                   (colorProfile->m_toLinear)._M_t.
                   super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
                   super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
              if (_Var3._M_head_impl == (unsigned_short *)0x0) {
LAB_0066ffde:
                qt_alphamapblit_argb32_oneline();
              }
              auVar32 = psllw(ZEXT716(CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short
                                                  )(((uint7)bVar37 << 0x30) >> 0x28),
                                                  CONCAT14(uVar36,uVar2)) >> 0x20),uVar2) >> 0x18),
                                                  CONCAT12(uVar35,uVar31)) >> 0x10),
                                               (ushort)(byte)uVar2) & 0xffffff00ffffff),4);
              uVar61 = SUB162(ZEXT116(bVar37) << 0x38,6);
              sVar41 = (_Var3._M_head_impl[auVar32._4_2_] >> 8) + _Var3._M_head_impl[auVar32._4_2_];
              sVar47 = (_Var3._M_head_impl[auVar32._2_2_] >> 8) + _Var3._M_head_impl[auVar32._2_2_];
              auVar39._2_2_ = sVar47;
              auVar39._0_2_ = sVar41;
              sVar48 = (_Var3._M_head_impl[auVar32._0_2_] >> 8) + _Var3._M_head_impl[auVar32._0_2_];
              auVar39._4_2_ = sVar48;
              sVar49 = (uVar61 >> 8) + uVar61;
              auVar39._6_2_ = sVar49;
              uVar29 = srcColor->rgba;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = uVar29;
              auVar39._8_8_ = 0;
              auVar51 = pshuflw(ZEXT216(CONCAT11(bVar1,bVar1)),ZEXT216(CONCAT11(bVar1,bVar1)),0);
              uVar61 = auVar51._6_2_ * (short)(uVar29 >> 0x30);
              auVar59._0_12_ = ZEXT212(uVar61) << 0x30;
              auVar32 = pmulhuw(auVar33,auVar51);
              auVar59._12_2_ = uVar61;
              auVar59._14_2_ = auVar32._6_2_;
              auVar58._12_4_ = auVar59._12_4_;
              auVar58._0_10_ = (unkuint10)uVar61 << 0x30;
              auVar58._10_2_ = auVar32._4_2_;
              Var22 = CONCAT64(auVar58._10_6_,
                               CONCAT22(auVar51._4_2_ * (short)(uVar29 >> 0x20),uVar61));
              auVar14._4_8_ = (long)((unkuint10)Var22 >> 0x10);
              auVar14._2_2_ = auVar32._2_2_;
              auVar14._0_2_ = auVar51._2_2_ * (short)(uVar29 >> 0x10);
              auVar6._10_2_ = 0;
              auVar6._0_10_ = auVar32._0_10_;
              auVar6._12_2_ = auVar32._6_2_;
              auVar10._8_2_ = auVar32._4_2_;
              auVar10._0_8_ = auVar32._0_8_;
              auVar10._10_4_ = auVar6._10_4_;
              auVar15._6_8_ = 0;
              auVar15._0_6_ = auVar10._8_6_;
              auVar34._0_4_ =
                   (int)((uint)auVar32._0_2_ + CONCAT22(auVar32._0_2_,auVar51._0_2_ * (short)uVar29)
                        + 0x8000) >> 0x10;
              auVar34._4_4_ =
                   (int)CONCAT82(SUB148(auVar15 << 0x40,6),auVar32._2_2_) + auVar14._0_4_ + 0x8000
                   >> 0x10;
              auVar34._8_4_ = auVar10._8_4_ + (int)((unkuint10)Var22 >> 0x10) + 0x8000 >> 0x10;
              auVar34._12_4_ = (int)((auVar6._10_4_ >> 0x10) + auVar58._12_4_ + 0x8000) >> 0x10;
              auVar32 = packssdw(auVar34,auVar34);
              auVar51 = ZEXT416((uVar27 ^ 0xff) << 8 | uVar27 ^ 0xff);
              auVar52 = pshuflw(auVar51,auVar51,0);
              uVar61 = sVar49 * auVar52._6_2_;
              auVar42._0_10_ = (unkuint10)uVar61 << 0x30;
              auVar43._0_12_ = ZEXT212(uVar61) << 0x30;
              auVar51 = pmulhuw(auVar39,auVar52);
              auVar43._12_2_ = uVar61;
              auVar43._14_2_ = auVar51._6_2_;
              auVar42._12_4_ = auVar43._12_4_;
              auVar42._10_2_ = auVar51._4_2_;
              Var22 = CONCAT64(auVar42._10_6_,CONCAT22(sVar48 * auVar52._4_2_,uVar61));
              auVar16._4_8_ = (long)((unkuint10)Var22 >> 0x10);
              auVar16._2_2_ = auVar51._2_2_;
              auVar16._0_2_ = sVar47 * auVar52._2_2_;
              auVar4._10_2_ = 0;
              auVar4._0_10_ = auVar51._0_10_;
              auVar4._12_2_ = auVar51._6_2_;
              auVar7._8_2_ = auVar51._4_2_;
              auVar7._0_8_ = auVar51._0_8_;
              auVar7._10_4_ = auVar4._10_4_;
              auVar17._6_8_ = 0;
              auVar17._0_6_ = auVar7._8_6_;
              auVar12._4_2_ = auVar51._2_2_;
              auVar12._0_4_ = auVar51._0_4_;
              auVar12._6_8_ = SUB148(auVar17 << 0x40,6);
              auVar40._0_4_ =
                   (int)((auVar51._0_4_ & 0xffff) + CONCAT22(auVar51._0_2_,sVar41 * auVar52._0_2_) +
                        0x8000) >> 0x10;
              auVar40._4_4_ = auVar12._4_4_ + auVar16._0_4_ + 0x8000 >> 0x10;
              auVar40._8_4_ = auVar7._8_4_ + (int)((unkuint10)Var22 >> 0x10) + 0x8000 >> 0x10;
              auVar40._12_4_ = (int)((auVar4._10_4_ >> 0x10) + auVar42._12_4_ + 0x8000) >> 0x10;
              auVar51 = packssdw(auVar40,auVar40);
              rgb64.rgba = CONCAT26(auVar51._6_2_ + auVar32._6_2_,
                                    CONCAT24(auVar51._4_2_ + auVar32._4_2_,
                                             CONCAT22(auVar51._2_2_ + auVar32._2_2_,
                                                      auVar51._0_2_ + auVar32._0_2_)));
            }
            QVar24 = QColorTrcLut::fromLinear64(colorProfile,rgb64);
          }
        }
        dest[uVar30] = QVar24;
      }
LAB_0066ffbe:
      uVar30 = uVar30 + 1;
    } while ((uint)mapWidth != uVar30);
  }
  return;
}

Assistant:

static void qt_alphamapblit_argb32_oneline(const uchar *map,
                                           int mapWidth, const QRgba64 &srcColor,
                                           quint32 *dest, const quint32 c,
                                           const QColorTrcLut *colorProfile)
{
    for (int i = 0; i < mapWidth; ++i)
        alphamapblend_argb32(dest + i, map[i], srcColor, c, colorProfile);
}